

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O1

string * duckdb::Base64Decode(string *__return_storage_ptr__,string *key)

{
  pointer pcVar1;
  string_t str;
  data_ptr_t output;
  void *pvVar2;
  uint uVar3;
  idx_t in_R8;
  string_t str_00;
  undefined8 in_stack_ffffffffffffffb8;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  uint local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pcVar1 = (key->_M_dataplus)._M_p;
  local_30 = (uint)key->_M_string_length;
  if (local_30 < 0xd) {
    uStack_24 = 0;
    uStack_2c = 0;
    uStack_28 = 0;
    if (local_30 != 0) {
      switchD_00b1522a::default(&uStack_2c,pcVar1,(ulong)(local_30 & 0xf));
    }
  }
  else {
    uStack_2c = *(undefined4 *)pcVar1;
    uStack_28 = SUB84(pcVar1,0);
    uStack_24 = (undefined4)((ulong)pcVar1 >> 0x20);
  }
  str.value.pointer.ptr = (char *)in_stack_ffffffffffffffb8;
  str.value._0_8_ = 0x1110f7d;
  output = (data_ptr_t)Blob::FromBase64Size(str);
  pvVar2 = operator_new__((ulong)output);
  pcVar1 = (key->_M_dataplus)._M_p;
  uVar3 = (uint)key->_M_string_length;
  if (uVar3 < 0xd) {
    uStack_34 = 0;
    uStack_3c = 0;
    uStack_38 = 0;
    if (uVar3 != 0) {
      switchD_00b1522a::default(&uStack_3c,pcVar1,(ulong)(uVar3 & 0xf));
    }
  }
  else {
    uStack_3c = *(undefined4 *)pcVar1;
    uStack_38 = SUB84(pcVar1,0);
    uStack_34 = (undefined4)((ulong)pcVar1 >> 0x20);
  }
  str_00.value._4_1_ = (undefined1)uStack_34;
  str_00.value._5_1_ = uStack_34._1_1_;
  str_00.value._6_1_ = uStack_34._2_1_;
  str_00.value._7_1_ = uStack_34._3_1_;
  str_00.value.pointer.length = uStack_38;
  str_00.value.pointer.ptr = (char *)pvVar2;
  Blob::FromBase64((Blob *)CONCAT44(uStack_3c,uVar3),str_00,output,in_R8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pvVar2,(data_ptr_t)((long)pvVar2 + (long)output));
  operator_delete__(pvVar2);
  return __return_storage_ptr__;
}

Assistant:

string Base64Decode(const string &key) {
	auto result_size = Blob::FromBase64Size(key);
	auto output = duckdb::unique_ptr<unsigned char[]>(new unsigned char[result_size]);
	Blob::FromBase64(key, output.get(), result_size);
	string decoded_key(reinterpret_cast<const char *>(output.get()), result_size);
	return decoded_key;
}